

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encryptor_test.cpp
# Opt level: O0

void run_test<cppcms::sessions::impl::hmac_factory>(string *name,string *k,bool is_signature)

{
  byte bVar1;
  bool bVar2;
  __type _Var3;
  char cVar4;
  char *pcVar5;
  pointer peVar6;
  ostream *poVar7;
  runtime_error *prVar8;
  ulong uVar9;
  ulong uVar10;
  byte in_DL;
  string *in_RSI;
  ostringstream oss_15;
  ostringstream oss_14;
  string b_1;
  string a_1;
  ostringstream oss_13;
  ostringstream oss_12;
  ostringstream oss_11;
  ostringstream oss_10;
  ostringstream oss_9;
  ostringstream oss_8;
  string b;
  ostringstream oss_7;
  string a;
  ostringstream oss_6;
  ostringstream oss_5;
  ostringstream oss_4;
  uint i;
  ostringstream oss_3;
  ostringstream oss_2;
  uint t;
  ostringstream oss_1;
  ostringstream oss;
  string plain;
  string cipher;
  unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_> enc;
  char c2;
  char c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffdeb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffdec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffded8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffdee0;
  string *psVar11;
  string *local_2118;
  key *in_stack_ffffffffffffdef0;
  string *in_stack_ffffffffffffdef8;
  string local_1d10 [32];
  ostringstream local_1cf0 [383];
  undefined1 local_1b71;
  string local_1b70 [32];
  ostringstream local_1b50 [376];
  string local_19d8 [32];
  key local_19b8 [24];
  string local_19a0 [32];
  key local_1980 [31];
  undefined1 local_1961;
  string local_1960 [32];
  ostringstream local_1940 [376];
  string local_17c8 [32];
  string local_17a8 [39];
  undefined1 local_1781;
  string local_1780 [32];
  ostringstream local_1760 [376];
  key local_15e8 [31];
  undefined1 local_15c9;
  string local_15c8 [32];
  ostringstream local_15a8 [376];
  key local_1430 [31];
  undefined1 local_1411;
  string local_1410 [32];
  ostringstream local_13f0 [376];
  key local_1278 [31];
  allocator local_1259;
  string local_1258 [32];
  string local_1238 [39];
  undefined1 local_1211;
  string local_1210 [32];
  ostringstream local_11f0 [383];
  allocator local_1071;
  string local_1070 [32];
  string local_1050 [39];
  undefined1 local_1029;
  string local_1028 [32];
  ostringstream local_1008 [383];
  allocator local_e89;
  string local_e88 [39];
  undefined1 local_e61;
  string local_e60 [32];
  ostringstream local_e40 [383];
  allocator local_cc1;
  string local_cc0 [39];
  undefined1 local_c99;
  string local_c98 [32];
  ostringstream local_c78 [383];
  allocator local_af9;
  string local_af8 [39];
  undefined1 local_ad1;
  string local_ad0 [32];
  ostringstream local_ab0 [383];
  undefined1 local_931;
  string local_930 [32];
  ostringstream local_910 [376];
  uint local_798;
  undefined1 local_791;
  string local_790 [32];
  ostringstream local_770 [383];
  undefined1 local_5f1;
  string local_5f0 [32];
  ostringstream local_5d0 [376];
  string local_458 [32];
  uint local_438;
  undefined1 local_433;
  allocator local_432;
  allocator local_431;
  string *local_430;
  string local_428 [32];
  string local_408 [32];
  string asStack_3e8 [7];
  undefined1 local_3e1;
  string local_3e0 [32];
  ostringstream local_3c0 [383];
  undefined1 local_241;
  string local_240 [32];
  ostringstream local_220 [376];
  string local_a8 [39];
  allocator local_81;
  string local_80 [32];
  string local_60 [48];
  key local_30 [29];
  char local_13;
  char local_12;
  byte local_11;
  
  local_11 = in_DL & 1;
  pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI);
  local_12 = *pcVar5;
  pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI);
  local_13 = *pcVar5;
  cppcms::crypto::key::key(local_30,in_RSI);
  gen<cppcms::sessions::impl::hmac_factory>(in_stack_ffffffffffffdef8,in_stack_ffffffffffffdef0);
  cppcms::crypto::key::~key(local_30);
  peVar6 = std::
           unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
           ::operator->((unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
                         *)0x10cab0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"Hello World",&local_81);
  (*(code *)**(undefined8 **)peVar6)(local_60,peVar6,local_80);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::__cxx11::string::string(local_a8);
  peVar6 = std::
           unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
           ::operator->((unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
                         *)0x10cb41);
  bVar1 = (**(code **)(*(long *)peVar6 + 8))(peVar6,local_60,local_a8);
  if ((bVar1 & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_220);
    poVar7 = std::operator<<((ostream *)local_220,"Error ");
    poVar7 = std::operator<<(poVar7,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                            );
    poVar7 = std::operator<<(poVar7,":");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x25);
    std::operator<<(poVar7," enc->decrypt(cipher,plain)");
    local_241 = 1;
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar8,local_240);
    local_241 = 0;
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar2 = std::operator==(in_stack_ffffffffffffdec0,(char *)in_stack_ffffffffffffdeb8);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_3c0);
    poVar7 = std::operator<<((ostream *)local_3c0,"Error ");
    poVar7 = std::operator<<(poVar7,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                            );
    poVar7 = std::operator<<(poVar7,":");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x26);
    std::operator<<(poVar7," plain==\"Hello World\"");
    local_3e1 = 1;
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar8,local_3e0);
    local_3e1 = 0;
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_433 = 1;
  local_430 = local_428;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_428,"",&local_431);
  local_430 = local_408;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_408,"x",&local_432);
  local_433 = 0;
  std::allocator<char>::~allocator((allocator<char> *)&local_432);
  std::allocator<char>::~allocator((allocator<char> *)&local_431);
  for (local_438 = 0; local_438 < 2; local_438 = local_438 + 1) {
    peVar6 = std::
             unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
             ::operator->((unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
                           *)0x10d014);
    (*(code *)**(undefined8 **)peVar6)(local_458,peVar6,local_428 + (ulong)local_438 * 0x20);
    std::__cxx11::string::operator=(local_60,local_458);
    std::__cxx11::string::~string(local_458);
    peVar6 = std::
             unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
             ::operator->((unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
                           *)0x10d06b);
    bVar1 = (**(code **)(*(long *)peVar6 + 8))(peVar6,local_60,local_a8);
    if ((bVar1 & 1) == 0) {
      std::__cxx11::ostringstream::ostringstream(local_5d0);
      poVar7 = std::operator<<((ostream *)local_5d0,"Error ");
      poVar7 = std::operator<<(poVar7,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                              );
      poVar7 = std::operator<<(poVar7,":");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x2b);
      std::operator<<(poVar7," enc->decrypt(cipher,plain)");
      local_5f1 = 1;
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar8,local_5f0);
      local_5f1 = 0;
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    _Var3 = std::operator==(in_stack_ffffffffffffdee0,in_stack_ffffffffffffded8);
    if (!_Var3) {
      std::__cxx11::ostringstream::ostringstream(local_770);
      poVar7 = std::operator<<((ostream *)local_770,"Error ");
      poVar7 = std::operator<<(poVar7,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                              );
      poVar7 = std::operator<<(poVar7,":");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x2c);
      std::operator<<(poVar7," plain==orig_text[t]");
      local_791 = 1;
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar8,local_790);
      local_791 = 0;
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    for (local_798 = 0; uVar9 = (ulong)local_798, uVar10 = std::__cxx11::string::size(),
        uVar9 < uVar10; local_798 = local_798 + 1) {
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_60);
      *pcVar5 = *pcVar5 + -1;
      peVar6 = std::
               unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
               ::operator->((unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
                             *)0x10d519);
      bVar1 = (**(code **)(*(long *)peVar6 + 8))(peVar6,local_60,local_a8);
      if ((bVar1 & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_910);
        poVar7 = std::operator<<((ostream *)local_910,"Error ");
        poVar7 = std::operator<<(poVar7,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                                );
        poVar7 = std::operator<<(poVar7,":");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x30);
        std::operator<<(poVar7," !enc->decrypt(cipher,plain)");
        local_931 = 1;
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar8,local_930);
        local_931 = 0;
        __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_60);
      *pcVar5 = *pcVar5 + '\x02';
      peVar6 = std::
               unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
               ::operator->((unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
                             *)0x10d712);
      bVar1 = (**(code **)(*(long *)peVar6 + 8))(peVar6,local_60,local_a8);
      if ((bVar1 & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_ab0);
        poVar7 = std::operator<<((ostream *)local_ab0,"Error ");
        poVar7 = std::operator<<(poVar7,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                                );
        poVar7 = std::operator<<(poVar7,":");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x32);
        std::operator<<(poVar7," !enc->decrypt(cipher,plain)");
        local_ad1 = 1;
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar8,local_ad0);
        local_ad1 = 0;
        __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_60);
      *pcVar5 = *pcVar5 + -1;
    }
  }
  peVar6 = std::
           unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
           ::operator->((unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
                         *)0x10d93a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_af8,"",&local_af9);
  bVar1 = (**(code **)(*(long *)peVar6 + 8))(peVar6,local_af8,local_a8);
  std::__cxx11::string::~string(local_af8);
  std::allocator<char>::~allocator((allocator<char> *)&local_af9);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_c78);
    poVar7 = std::operator<<((ostream *)local_c78,"Error ");
    poVar7 = std::operator<<(poVar7,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                            );
    poVar7 = std::operator<<(poVar7,":");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x36);
    std::operator<<(poVar7," !enc->decrypt(\"\",plain)");
    local_c99 = 1;
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar8,local_c98);
    local_c99 = 0;
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_cc0,0x40,'\0',&local_cc1);
  std::allocator<char>::~allocator((allocator<char> *)&local_cc1);
  peVar6 = std::
           unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
           ::operator->((unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
                         *)0x10dbf6);
  bVar1 = (**(code **)(*(long *)peVar6 + 8))(peVar6,local_cc0,local_a8);
  if ((bVar1 & 1) != 0) {
    std::__cxx11::ostringstream::ostringstream(local_e40);
    poVar7 = std::operator<<((ostream *)local_e40,"Error ");
    poVar7 = std::operator<<(poVar7,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                            );
    poVar7 = std::operator<<(poVar7,":");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x38);
    std::operator<<(poVar7," !enc->decrypt(a,plain)");
    local_e61 = 1;
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar8,local_e60);
    local_e61 = 0;
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e88,0x40,-1,&local_e89);
  std::allocator<char>::~allocator((allocator<char> *)&local_e89);
  peVar6 = std::
           unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
           ::operator->((unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
                         *)0x10de41);
  bVar1 = (**(code **)(*(long *)peVar6 + 8))(peVar6,local_e88,local_a8);
  if ((bVar1 & 1) != 0) {
    std::__cxx11::ostringstream::ostringstream(local_1008);
    poVar7 = std::operator<<((ostream *)local_1008,"Error ");
    poVar7 = std::operator<<(poVar7,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                            );
    poVar7 = std::operator<<(poVar7,":");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x3a);
    std::operator<<(poVar7," !enc->decrypt(b,plain)");
    local_1029 = 1;
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar8,local_1028);
    local_1029 = 0;
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  peVar6 = std::
           unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
           ::operator->((unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
                         *)0x10e049);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1070,"",&local_1071);
  (*(code *)**(undefined8 **)peVar6)(local_1050,peVar6,local_1070);
  std::__cxx11::string::operator=(local_60,local_1050);
  std::__cxx11::string::~string(local_1050);
  std::__cxx11::string::~string(local_1070);
  std::allocator<char>::~allocator((allocator<char> *)&local_1071);
  peVar6 = std::
           unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
           ::operator->((unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
                         *)0x10e0ef);
  bVar1 = (**(code **)(*(long *)peVar6 + 8))(peVar6,local_60,local_a8);
  if (((bVar1 & 1) == 0) ||
     (bVar2 = std::operator==(in_stack_ffffffffffffdec0,(char *)in_stack_ffffffffffffdeb8), !bVar2))
  {
    std::__cxx11::ostringstream::ostringstream(local_11f0);
    poVar7 = std::operator<<((ostream *)local_11f0,"Error ");
    poVar7 = std::operator<<(poVar7,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                            );
    poVar7 = std::operator<<(poVar7,":");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x3c);
    std::operator<<(poVar7," enc->decrypt(cipher,plain) && plain==\"\"");
    local_1211 = 1;
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar8,local_1210);
    local_1211 = 0;
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  peVar6 = std::
           unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
           ::operator->((unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
                         *)0x10e31b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1258,"test",&local_1259);
  (*(code *)**(undefined8 **)peVar6)(local_1238,peVar6,local_1258);
  std::__cxx11::string::operator=(local_60,local_1238);
  std::__cxx11::string::~string(local_1238);
  std::__cxx11::string::~string(local_1258);
  std::allocator<char>::~allocator((allocator<char> *)&local_1259);
  cVar4 = local_12 + '\x01';
  pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI);
  *pcVar5 = cVar4;
  cppcms::crypto::key::key(local_1278,in_RSI);
  gen<cppcms::sessions::impl::hmac_factory>(in_stack_ffffffffffffdef8,in_stack_ffffffffffffdef0);
  std::unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>::
  operator=((unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
             *)in_stack_ffffffffffffdec0,
            (unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
             *)in_stack_ffffffffffffdeb8);
  std::unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>::
  ~unique_ptr((unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
               *)in_stack_ffffffffffffdec0);
  cppcms::crypto::key::~key(local_1278);
  peVar6 = std::
           unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
           ::operator->((unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
                         *)0x10e46a);
  bVar1 = (**(code **)(*(long *)peVar6 + 8))(peVar6,local_60,local_a8);
  cVar4 = local_12;
  if ((bVar1 & 1) != 0) {
    std::__cxx11::ostringstream::ostringstream(local_13f0);
    poVar7 = std::operator<<((ostream *)local_13f0,"Error ");
    poVar7 = std::operator<<(poVar7,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                            );
    poVar7 = std::operator<<(poVar7,":");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x40);
    std::operator<<(poVar7," !enc->decrypt(cipher,plain)");
    local_1411 = 1;
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar8,local_1410);
    local_1411 = 0;
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI);
  *pcVar5 = cVar4;
  cVar4 = local_13 + '\x01';
  pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI);
  *pcVar5 = cVar4;
  cppcms::crypto::key::key(local_1430,in_RSI);
  gen<cppcms::sessions::impl::hmac_factory>(in_stack_ffffffffffffdef8,in_stack_ffffffffffffdef0);
  std::unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>::
  operator=((unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
             *)in_stack_ffffffffffffdec0,
            (unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
             *)in_stack_ffffffffffffdeb8);
  std::unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>::
  ~unique_ptr((unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
               *)in_stack_ffffffffffffdec0);
  cppcms::crypto::key::~key(local_1430);
  peVar6 = std::
           unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
           ::operator->((unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
                         *)0x10e77e);
  bVar1 = (**(code **)(*(long *)peVar6 + 8))(peVar6,local_60,local_a8);
  cVar4 = local_13;
  if ((bVar1 & 1) == 0) {
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI);
    *pcVar5 = cVar4;
    cppcms::crypto::key::key(local_15e8,in_RSI);
    gen<cppcms::sessions::impl::hmac_factory>(in_stack_ffffffffffffdef8,in_stack_ffffffffffffdef0);
    std::unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
    ::operator=((unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
                 *)in_stack_ffffffffffffdec0,
                (unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
                 *)in_stack_ffffffffffffdeb8);
    std::unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
    ::~unique_ptr((unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
                   *)in_stack_ffffffffffffdec0);
    cppcms::crypto::key::~key(local_15e8);
    peVar6 = std::
             unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
             ::operator->((unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
                           *)0x10ea0d);
    bVar1 = (**(code **)(*(long *)peVar6 + 8))(peVar6,local_60,local_a8);
    if (((bVar1 & 1) == 0) ||
       (bVar2 = std::operator==(in_stack_ffffffffffffdec0,(char *)in_stack_ffffffffffffdeb8), !bVar2
       )) {
      std::__cxx11::ostringstream::ostringstream(local_1760);
      poVar7 = std::operator<<((ostream *)local_1760,"Error ");
      poVar7 = std::operator<<(poVar7,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                              );
      poVar7 = std::operator<<(poVar7,":");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x47);
      std::operator<<(poVar7," enc->decrypt(cipher,plain) && plain==\"test\"");
      local_1781 = 1;
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar8,local_1780);
      local_1781 = 0;
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((local_11 & 1) == 0) {
      peVar6 = std::
               unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
               ::operator->((unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
                             *)0x10ec26);
      (*(code *)**(undefined8 **)peVar6)(local_17a8,peVar6,local_a8);
      peVar6 = std::
               unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
               ::operator->((unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
                             *)0x10ec50);
      (*(code *)**(undefined8 **)peVar6)(local_17c8,peVar6,local_a8);
      bVar2 = std::operator!=(in_stack_ffffffffffffdec0,in_stack_ffffffffffffdeb8);
      std::__cxx11::string::~string(local_17c8);
      std::__cxx11::string::~string(local_17a8);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream(local_1940);
        poVar7 = std::operator<<((ostream *)local_1940,"Error ");
        poVar7 = std::operator<<(poVar7,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                                );
        poVar7 = std::operator<<(poVar7,":");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x4a);
        std::operator<<(poVar7," enc->encrypt(plain)!=enc->encrypt(plain)");
        local_1961 = 1;
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar8,local_1960);
        local_1961 = 0;
        __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      cppcms::crypto::key::key(local_1980,in_RSI);
      gen<cppcms::sessions::impl::hmac_factory>(in_stack_ffffffffffffdef8,in_stack_ffffffffffffdef0)
      ;
      std::
      unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>::
      operator=((unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
                 *)in_stack_ffffffffffffdec0,
                (unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
                 *)in_stack_ffffffffffffdeb8);
      std::
      unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>::
      ~unique_ptr((unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
                   *)in_stack_ffffffffffffdec0);
      cppcms::crypto::key::~key(local_1980);
      peVar6 = std::
               unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
               ::operator->((unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
                             *)0x10eee2);
      (*(code *)**(undefined8 **)peVar6)(local_19a0,peVar6,local_a8);
      cppcms::crypto::key::key(local_19b8,in_RSI);
      gen<cppcms::sessions::impl::hmac_factory>(in_stack_ffffffffffffdef8,in_stack_ffffffffffffdef0)
      ;
      std::
      unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>::
      operator=((unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
                 *)in_stack_ffffffffffffdec0,
                (unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
                 *)in_stack_ffffffffffffdeb8);
      std::
      unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>::
      ~unique_ptr((unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
                   *)in_stack_ffffffffffffdec0);
      cppcms::crypto::key::~key(local_19b8);
      peVar6 = std::
               unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
               ::operator->((unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
                             *)0x10ef81);
      (*(code *)**(undefined8 **)peVar6)(local_19d8,peVar6,local_a8);
      bVar2 = std::operator!=(in_stack_ffffffffffffdec0,in_stack_ffffffffffffdeb8);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream(local_1b50);
        poVar7 = std::operator<<((ostream *)local_1b50,"Error ");
        poVar7 = std::operator<<(poVar7,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                                );
        poVar7 = std::operator<<(poVar7,":");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x4f);
        std::operator<<(poVar7," a!=b");
        local_1b71 = 1;
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar8,local_1b70);
        local_1b71 = 0;
        __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::operator=(local_a8,"XX");
      peVar6 = std::
               unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
               ::operator->((unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
                             *)0x10f1d0);
      bVar1 = (**(code **)(*(long *)peVar6 + 8))(peVar6,local_19a0,local_a8);
      if (((bVar1 & 1) == 0) ||
         (bVar2 = std::operator==(in_stack_ffffffffffffdec0,(char *)in_stack_ffffffffffffdeb8),
         !bVar2)) {
        std::__cxx11::ostringstream::ostringstream(local_1cf0);
        poVar7 = std::operator<<((ostream *)local_1cf0,"Error ");
        poVar7 = std::operator<<(poVar7,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                                );
        poVar7 = std::operator<<(poVar7,":");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x51);
        std::operator<<(poVar7," enc->decrypt(a,plain) && plain == \"test\"");
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar8,local_1d10);
        __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::~string(local_19d8);
      std::__cxx11::string::~string(local_19a0);
    }
    std::__cxx11::string::~string(local_e88);
    std::__cxx11::string::~string(local_cc0);
    psVar11 = local_428;
    local_2118 = asStack_3e8;
    do {
      local_2118 = local_2118 + -0x20;
      std::__cxx11::string::~string(local_2118);
    } while (local_2118 != psVar11);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string(local_60);
    std::unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
    ::~unique_ptr((unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
                   *)in_stack_ffffffffffffdec0);
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_15a8);
  poVar7 = std::operator<<((ostream *)local_15a8,"Error ");
  poVar7 = std::operator<<(poVar7,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                          );
  poVar7 = std::operator<<(poVar7,":");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x44);
  std::operator<<(poVar7," !enc->decrypt(cipher,plain)");
  local_15c9 = 1;
  prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::runtime_error::runtime_error(prVar8,local_15c8);
  local_15c9 = 0;
  __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void run_test(std::string name,std::string k,bool is_signature = false) 
{
	using cppcms::crypto::key;
	char c1=k[0];
	char c2=k[31];
	std::unique_ptr<cppcms::sessions::encryptor> enc = gen<Encryptor>(name,key(k));
	std::string cipher=enc->encrypt("Hello World");
	std::string plain;
	TEST(enc->decrypt(cipher,plain));
	TEST(plain=="Hello World");

	std::string orig_text[2]= { "", "x" };
	for(unsigned t=0;t<2;t++) {
		cipher=enc->encrypt(orig_text[t]);
		TEST(enc->decrypt(cipher,plain));
		TEST(plain==orig_text[t]);

		for(unsigned i=0;i<cipher.size();i++) {
			cipher[i]--;
			TEST(!enc->decrypt(cipher,plain));
			cipher[i]+=2;
			TEST(!enc->decrypt(cipher,plain));
			cipher[i]--;
		}
	}
	TEST(!enc->decrypt("",plain));
	std::string a(64,'\0');
	TEST(!enc->decrypt(a,plain));
	std::string b(64,'\xFF');
	TEST(!enc->decrypt(b,plain));
	cipher=enc->encrypt("");
	TEST(enc->decrypt(cipher,plain) && plain=="");
	cipher=enc->encrypt("test");
	k[0]=c1+1;
	enc = gen<Encryptor>(name,key(k));
	TEST(!enc->decrypt(cipher,plain));
	k[0]=c1;
	k[31]=c2+1;
	enc = gen<Encryptor>(name,key(k));
	TEST(!enc->decrypt(cipher,plain));
	k[31]=c2;
	enc = gen<Encryptor>(name,key(k));
	TEST(enc->decrypt(cipher,plain) && plain=="test");
	// Salt works
	if(!is_signature) {
		TEST(enc->encrypt(plain)!=enc->encrypt(plain));
		enc = gen<Encryptor>(name,key(k));
		std::string a=enc->encrypt(plain);
		enc = gen<Encryptor>(name,key(k));
		std::string b=enc->encrypt(plain);
		TEST(a!=b);
		plain="XX";
		TEST(enc->decrypt(a,plain) && plain == "test");
	}
}